

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlcpy.c
# Opt level: O0

unsigned_long strlcpy(char *dst,char *src,size_t siz)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  size_t local_38;
  size_t n;
  char *s;
  char *d;
  size_t siz_local;
  char *src_local;
  char *dst_local;
  
  local_38 = siz;
  n = (size_t)src;
  s = dst;
  if (siz != 0) {
    pcVar2 = src;
    for (local_38 = siz - 1; n = (size_t)pcVar2, s = dst, local_38 != 0; local_38 = local_38 - 1) {
      n = (size_t)(pcVar2 + 1);
      cVar1 = *pcVar2;
      s = dst + 1;
      *dst = cVar1;
      if (cVar1 == '\0') break;
      dst = s;
      pcVar2 = (char *)n;
    }
  }
  if (local_38 == 0) {
    if (siz != 0) {
      *s = '\0';
    }
    do {
      sVar3 = n + 1;
      cVar1 = *(char *)n;
      n = sVar3;
    } while (cVar1 != '\0');
  }
  return (n - (long)src) - 1;
}

Assistant:

size_t
strlcpy(char *dst, const char *src, size_t siz)
{
	char *d = dst;
	const char *s = src;
	size_t n = siz;

	_DIAGASSERT(dst != NULL);
	_DIAGASSERT(src != NULL);

	/* Copy as many bytes as will fit */
	if (n != 0 && --n != 0) {
		do {
			if ((*d++ = *s++) == 0)
				break;
		} while (--n != 0);
	}

	/* Not enough room in dst, add NUL and traverse rest of src */
	if (n == 0) {
		if (siz != 0)
			*d = '\0';		/* NUL-terminate dst */
		while (*s++)
			;
	}

	return(s - src - 1);	/* count does not include NUL */
}